

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O0

bool __thiscall iDynTree::SpatialInertia::isPhysicallyConsistent(SpatialInertia *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  CoeffReturnType pdVar4;
  SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_RDI;
  double Czz;
  double Cyy;
  double Cxx;
  double Izz;
  double Iyy;
  double Ixx;
  SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> eigenValuesSolver;
  RotationalInertia inertiaAtCOM;
  bool isConsistent;
  Index in_stack_fffffffffffffeb8;
  MatrixFixSize<3U,_3U> *in_stack_fffffffffffffed8;
  int in_stack_ffffffffffffff1c;
  EigenBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff20;
  SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffffe8;
  byte bVar5;
  bool local_1;
  
  bVar5 = 1;
  if (0.0 < (in_RDI->m_eivec).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
            .m_data.array[0]) {
    getRotationalInertiaWrtCenterOfMass((SpatialInertia *)CONCAT17(1,in_stack_ffffffffffffffe8));
    Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::SelfAdjointEigenSolver
              (in_RDI);
    toEigen<3u,3u>(in_stack_fffffffffffffed8);
    Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,3,3,0,3,3>>::
    compute<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::eigenvalues
              ((SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               &stack0xffffffffffffff08);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)in_RDI,
                        in_stack_fffffffffffffeb8);
    dVar1 = *pdVar4;
    Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::eigenvalues
              ((SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               &stack0xffffffffffffff08);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)in_RDI,
                        in_stack_fffffffffffffeb8);
    dVar2 = *pdVar4;
    Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::eigenvalues
              ((SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               &stack0xffffffffffffff08);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)in_RDI,
                        in_stack_fffffffffffffeb8);
    dVar3 = *pdVar4;
    if (((((dVar2 + dVar3) - dVar1) / 2.0 < 0.0) || (((dVar1 + dVar3) - dVar2) / 2.0 < 0.0)) ||
       (((dVar1 + dVar2) - dVar3) / 2.0 < 0.0)) {
      bVar5 = 0;
    }
    local_1 = (bool)(bVar5 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SpatialInertia::isPhysicallyConsistent() const
{
    using namespace Eigen;

    bool isConsistent = true;

    // check that the mass is positive
    if( this->m_mass <= 0 )
    {
        isConsistent = false;
        return isConsistent;
    }

    // We get the inertia at the COM
    RotationalInertia inertiaAtCOM = this->getRotationalInertiaWrtCenterOfMass();

    // We get the inertia at the principal axis using eigen
    SelfAdjointEigenSolver<Matrix<double,3,3,RowMajor> > eigenValuesSolver;

    // We check both the positive definitiveness of the matrix and the triangle
    // inequality by directly checking the central second moment of mass of the rigid body
    // In a nutshell, we have that:
    // Ixx = Cyy + Czz
    // Iyy = Cxx + Czz
    // Izz = Cxx + Cyy
    // so
    // Cxx = (Iyy + Izz - Ixx)/2
    // Cyy = (Ixx + Izz - Iyy)/2
    // Czz = (Ixx + Iyy - Izz)/2
    // Then all the condition boils down to:
    // Cxx >= 0 , Cyy >= 0 , Czz >= 0
    eigenValuesSolver.compute( toEigen(inertiaAtCOM) );

    double Ixx = eigenValuesSolver.eigenvalues()(0);
    double Iyy = eigenValuesSolver.eigenvalues()(1);
    double Izz = eigenValuesSolver.eigenvalues()(2);

    double Cxx = (Iyy + Izz - Ixx)/2;
    double Cyy = (Ixx + Izz - Iyy)/2;
    double Czz = (Ixx + Iyy - Izz)/2;

    // We are accepting the configuration where C** is zero
    // so that we don't mark a point mass as physically inconsistent
    if( Cxx < 0 ||
        Cyy < 0 ||
        Czz < 0 )
    {
        isConsistent = false;
    }

    return isConsistent;
}